

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
bioparser::Parser<biosoup::Sequence>::Store(Parser<biosoup::Sequence> *this,size_t count,bool strip)

{
  int iVar1;
  ulong uVar2;
  invalid_argument *this_00;
  pointer pcVar3;
  pointer pcVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  
  uVar6 = (ulong)this->buffer_ptr_;
  pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar3) < uVar6 + count) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: buffer overflow");
  }
  else {
    uVar7 = (ulong)this->storage_ptr_;
    if (uVar7 + count >> 0x20 == 0) {
      pcVar4 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = (long)(this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar4;
      if (uVar2 < uVar7 + count) {
        std::vector<char,_std::allocator<char>_>::resize(&this->storage_,uVar2 * 2);
        uVar7 = (ulong)this->storage_ptr_;
        pcVar4 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (ulong)this->buffer_ptr_;
        pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      memcpy(pcVar4 + uVar7,pcVar3 + uVar6,count);
      iVar8 = (int)count;
      if (strip) {
        uVar9 = this->storage_ptr_;
        pcVar3 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = iVar8 + 1;
        uVar6 = count & 0xffffffff;
        do {
          if (uVar6 == 0) {
            iVar5 = 0;
            break;
          }
          iVar1 = isspace((int)pcVar3[uVar6 + ((ulong)uVar9 - 1)]);
          iVar5 = iVar5 + -1;
          uVar6 = uVar6 - 1;
        } while (iVar1 != 0);
      }
      else {
        uVar9 = this->storage_ptr_;
        iVar5 = iVar8;
      }
      this->storage_ptr_ = uVar9 + iVar5;
      this->buffer_ptr_ = this->buffer_ptr_ + iVar8 + 1;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: storage overflow");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Store(std::size_t count, bool strip = false) {
    if (buffer_ptr_ + count > buffer_.size()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: buffer overflow");
    }
    if (storage_ptr_ + count > std::numeric_limits<std::uint32_t>::max()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: storage overflow");
    }
    if (storage_ptr_ + count > storage_.size()) {
      storage_.resize(2 * storage_.size());
    }
    std::memcpy(&storage_[storage_ptr_], &buffer_[buffer_ptr_], count);
    storage_ptr_ += strip ? RightStrip(&storage_[storage_ptr_], count) : count;
    buffer_ptr_ += count + 1;  // ignore sought character
  }